

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2StartElementNs
               (void *ctx,xmlChar *localname,xmlChar *prefix,xmlChar *URI,int nb_namespaces,
               xmlChar **namespaces,int nb_attributes,int nb_defaulted,xmlChar **attributes)

{
  xmlNodePtr cur;
  xmlChar *href;
  uint uVar1;
  xmlChar *pxVar2;
  xmlRegisterNodeFunc *pp_Var3;
  xmlNsPtr pxVar4;
  int iVar5;
  int chk;
  xmlChar *fullname_1;
  xmlChar *fullname;
  int j;
  int i;
  xmlChar *lname;
  xmlChar *pref;
  xmlChar *uri;
  xmlNsPtr ns;
  xmlNsPtr last;
  xmlNodePtr parent;
  xmlNodePtr ret;
  xmlParserCtxtPtr ctxt;
  xmlChar **namespaces_local;
  int nb_namespaces_local;
  xmlChar *URI_local;
  xmlChar *prefix_local;
  xmlChar *localname_local;
  void *ctx_local;
  
  ns = (xmlNsPtr)0x0;
  _j = (xmlChar *)0x0;
  if (ctx != (void *)0x0) {
    cur = *(xmlNodePtr *)((long)ctx + 0x50);
    if (((*(int *)((long)ctx + 0x9c) != 0) && (*(long *)(*(long *)((long)ctx + 0x10) + 0x58) == 0))
       && ((*(long *)(*(long *)((long)ctx + 0x10) + 0x50) == 0 ||
           ((((*(long *)(*(long *)(*(long *)((long)ctx + 0x10) + 0x50) + 0x48) == 0 &&
              (*(long *)(*(long *)(*(long *)((long)ctx + 0x10) + 0x50) + 0x50) == 0)) &&
             (*(long *)(*(long *)(*(long *)((long)ctx + 0x10) + 0x50) + 0x58) == 0)) &&
            (*(long *)(*(long *)(*(long *)((long)ctx + 0x10) + 0x50) + 0x60) == 0)))))) {
      xmlErrValid((xmlParserCtxtPtr)ctx,XML_DTD_NO_DTD,"Validation failed: no DTD found !",
                  (char *)0x0,(char *)0x0);
      *(undefined4 *)((long)ctx + 0x9c) = 0;
    }
    prefix_local = localname;
    if ((prefix != (xmlChar *)0x0) && (prefix_local = localname, URI == (xmlChar *)0x0)) {
      if (*(int *)((long)ctx + 0x238) == 0) {
        _j = xmlBuildQName(localname,prefix,(xmlChar *)0x0,0);
        prefix_local = localname;
      }
      else {
        pxVar2 = xmlDictQLookup(*(xmlDictPtr *)((long)ctx + 0x1c8),prefix,localname);
        prefix_local = localname;
        if (pxVar2 != (xmlChar *)0x0) {
          prefix_local = pxVar2;
        }
      }
    }
    if (*(long *)((long)ctx + 0x240) == 0) {
      if (*(int *)((long)ctx + 0x238) == 0) {
        if (_j == (xmlChar *)0x0) {
          parent = xmlNewDocNode(*(xmlDocPtr *)((long)ctx + 0x10),(xmlNsPtr)0x0,prefix_local,
                                 (xmlChar *)0x0);
        }
        else {
          parent = xmlNewDocNodeEatName
                             (*(xmlDocPtr *)((long)ctx + 0x10),(xmlNsPtr)0x0,_j,(xmlChar *)0x0);
        }
      }
      else {
        parent = xmlNewDocNodeEatName
                           (*(xmlDocPtr *)((long)ctx + 0x10),(xmlNsPtr)0x0,prefix_local,
                            (xmlChar *)0x0);
      }
      if (parent == (xmlNodePtr)0x0) {
        xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx,"xmlSAX2StartElementNs");
        return;
      }
    }
    else {
      parent = *(xmlNodePtr *)((long)ctx + 0x240);
      *(_xmlNode **)((long)ctx + 0x240) = parent->next;
      *(int *)((long)ctx + 0x23c) = *(int *)((long)ctx + 0x23c) + -1;
      memset(parent,0,0x78);
      parent->doc = *(_xmlDoc **)((long)ctx + 0x10);
      parent->type = XML_ELEMENT_NODE;
      if (*(int *)((long)ctx + 0x238) == 0) {
        if (_j == (xmlChar *)0x0) {
          pxVar2 = xmlStrdup(prefix_local);
          parent->name = pxVar2;
        }
        else {
          parent->name = _j;
        }
        if (parent->name == (xmlChar *)0x0) {
          xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx,"xmlSAX2StartElementNs");
          return;
        }
      }
      else {
        parent->name = prefix_local;
      }
      if ((__xmlRegisterCallbacks != 0) &&
         (pp_Var3 = __xmlRegisterNodeDefaultValue(), *pp_Var3 != (xmlRegisterNodeFunc)0x0)) {
        pp_Var3 = __xmlRegisterNodeDefaultValue();
        (**pp_Var3)(parent);
      }
    }
    if ((*(int *)((long)ctx + 0x1b4) != 0) && (*(long *)((long)ctx + 0x38) != 0)) {
      if (*(uint *)(*(long *)((long)ctx + 0x38) + 0x34) < 0xffff) {
        parent->line = (unsigned_short)*(undefined4 *)(*(long *)((long)ctx + 0x38) + 0x34);
      }
      else {
        parent->line = 0xffff;
      }
    }
    if (cur == (xmlNodePtr)0x0) {
      xmlAddChild(*(xmlNodePtr *)((long)ctx + 0x10),parent);
    }
    fullname._4_4_ = 0;
    for (fullname._0_4_ = 0; (int)fullname < nb_namespaces; fullname._0_4_ = (int)fullname + 1) {
      iVar5 = fullname._4_4_ + 1;
      pxVar2 = namespaces[fullname._4_4_];
      fullname._4_4_ = fullname._4_4_ + 2;
      href = namespaces[iVar5];
      pxVar4 = xmlNewNs((xmlNodePtr)0x0,href,pxVar2);
      if (pxVar4 != (xmlNsPtr)0x0) {
        if (ns == (xmlNsPtr)0x0) {
          parent->nsDef = pxVar4;
        }
        else {
          ns->next = pxVar4;
        }
        if ((URI != (xmlChar *)0x0) && (prefix == pxVar2)) {
          parent->ns = pxVar4;
        }
        ns = pxVar4;
        if ((((*(int *)((long)ctx + 0x34) == 0) && (*(int *)((long)ctx + 0x9c) != 0)) &&
            (*(int *)((long)ctx + 0x18) != 0)) &&
           ((*(long *)((long)ctx + 0x10) != 0 &&
            (*(long *)(*(long *)((long)ctx + 0x10) + 0x50) != 0)))) {
          uVar1 = xmlValidateOneNamespace
                            ((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10),
                             parent,prefix,pxVar4,href);
          *(uint *)((long)ctx + 0x98) = uVar1 & *(uint *)((long)ctx + 0x98);
        }
      }
    }
    *(undefined4 *)((long)ctx + 0x1a0) = 0xffffffff;
    iVar5 = nodePush((xmlParserCtxtPtr)ctx,parent);
    if (iVar5 < 0) {
      xmlUnlinkNode(parent);
      xmlFreeNode(parent);
    }
    else {
      if (cur != (xmlNodePtr)0x0) {
        if (cur->type == XML_ELEMENT_NODE) {
          xmlAddChild(cur,parent);
        }
        else {
          xmlAddSibling(cur,parent);
        }
      }
      if ((nb_defaulted != 0) && ((*(uint *)((long)ctx + 0x1b0) & 4) == 0)) {
        nb_attributes = nb_attributes - nb_defaulted;
      }
      if ((URI != (xmlChar *)0x0) && (parent->ns == (xmlNs *)0x0)) {
        pxVar4 = xmlSearchNs(*(xmlDocPtr *)((long)ctx + 0x10),cur,prefix);
        parent->ns = pxVar4;
        if ((parent->ns == (xmlNs *)0x0) && (iVar5 = xmlStrEqual(prefix,"xml"), iVar5 != 0)) {
          pxVar4 = xmlSearchNs(*(xmlDocPtr *)((long)ctx + 0x10),parent,prefix);
          parent->ns = pxVar4;
        }
        if (parent->ns == (xmlNs *)0x0) {
          pxVar4 = xmlNewNs(parent,(xmlChar *)0x0,prefix);
          if (pxVar4 == (xmlNsPtr)0x0) {
            xmlSAX2ErrMemory((xmlParserCtxtPtr)ctx,"xmlSAX2StartElementNs");
            return;
          }
          if (prefix == (xmlChar *)0x0) {
            xmlNsWarnMsg((xmlParserCtxtPtr)ctx,XML_NS_ERR_UNDEFINED_NAMESPACE,
                         "Namespace default prefix was not found\n",(xmlChar *)0x0,(xmlChar *)0x0);
          }
          else {
            xmlNsWarnMsg((xmlParserCtxtPtr)ctx,XML_NS_ERR_UNDEFINED_NAMESPACE,
                         "Namespace prefix %s was not found\n",prefix,(xmlChar *)0x0);
          }
        }
      }
      if (0 < nb_attributes) {
        fullname._0_4_ = 0;
        for (fullname._4_4_ = 0; fullname._4_4_ < nb_attributes; fullname._4_4_ = fullname._4_4_ + 1
            ) {
          if ((attributes[(int)fullname + 1] == (xmlChar *)0x0) ||
             (attributes[(int)fullname + 2] != (xmlChar *)0x0)) {
LAB_001afb28:
            xmlSAX2AttributeNs((xmlParserCtxtPtr)ctx,attributes[(int)fullname],
                               attributes[(int)fullname + 1],attributes[(int)fullname + 3],
                               attributes[(int)fullname + 4]);
          }
          else if (*(int *)((long)ctx + 0x238) == 0) {
            pxVar2 = xmlBuildQName(attributes[(int)fullname],attributes[(int)fullname + 1],
                                   (xmlChar *)0x0,0);
            if (pxVar2 == (xmlChar *)0x0) goto LAB_001afb28;
            xmlSAX2AttributeNs((xmlParserCtxtPtr)ctx,pxVar2,(xmlChar *)0x0,
                               attributes[(int)fullname + 3],attributes[(int)fullname + 4]);
            (*xmlFree)(pxVar2);
          }
          else {
            pxVar2 = xmlDictQLookup(*(xmlDictPtr *)((long)ctx + 0x1c8),attributes[(int)fullname + 1]
                                    ,attributes[(int)fullname]);
            if (pxVar2 == (xmlChar *)0x0) goto LAB_001afb28;
            xmlSAX2AttributeNs((xmlParserCtxtPtr)ctx,pxVar2,(xmlChar *)0x0,
                               attributes[(int)fullname + 3],attributes[(int)fullname + 4]);
          }
          fullname._0_4_ = (int)fullname + 5;
        }
      }
      if ((*(int *)((long)ctx + 0x9c) != 0) && ((*(uint *)((long)ctx + 0xd0) & 1) == 0)) {
        iVar5 = xmlValidateDtdFinal((xmlValidCtxtPtr)((long)ctx + 0xa0),
                                    *(xmlDocPtr *)((long)ctx + 0x10));
        if (iVar5 < 1) {
          *(undefined4 *)((long)ctx + 0x98) = 0;
        }
        if (iVar5 < 0) {
          *(undefined4 *)((long)ctx + 0x18) = 0;
        }
        uVar1 = xmlValidateRoot((xmlValidCtxtPtr)((long)ctx + 0xa0),*(xmlDocPtr *)((long)ctx + 0x10)
                               );
        *(uint *)((long)ctx + 0x98) = uVar1 & *(uint *)((long)ctx + 0x98);
        *(uint *)((long)ctx + 0xd0) = *(uint *)((long)ctx + 0xd0) | 1;
      }
    }
  }
  return;
}

Assistant:

void
xmlSAX2StartElementNs(void *ctx,
                      const xmlChar *localname,
		      const xmlChar *prefix,
		      const xmlChar *URI,
		      int nb_namespaces,
		      const xmlChar **namespaces,
		      int nb_attributes,
		      int nb_defaulted,
		      const xmlChar **attributes)
{
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlNodePtr ret;
    xmlNodePtr parent;
    xmlNsPtr last = NULL, ns;
    const xmlChar *uri, *pref;
    xmlChar *lname = NULL;
    int i, j;

    if (ctx == NULL) return;
    parent = ctxt->node;
    /*
     * First check on validity:
     */
    if (ctxt->validate && (ctxt->myDoc->extSubset == NULL) &&
        ((ctxt->myDoc->intSubset == NULL) ||
	 ((ctxt->myDoc->intSubset->notations == NULL) &&
	  (ctxt->myDoc->intSubset->elements == NULL) &&
	  (ctxt->myDoc->intSubset->attributes == NULL) &&
	  (ctxt->myDoc->intSubset->entities == NULL)))) {
	xmlErrValid(ctxt, XML_DTD_NO_DTD,
	  "Validation failed: no DTD found !", NULL, NULL);
	ctxt->validate = 0;
    }

    /*
     * Take care of the rare case of an undefined namespace prefix
     */
    if ((prefix != NULL) && (URI == NULL)) {
        if (ctxt->dictNames) {
	    const xmlChar *fullname;

	    fullname = xmlDictQLookup(ctxt->dict, prefix, localname);
	    if (fullname != NULL)
	        localname = fullname;
	} else {
	    lname = xmlBuildQName(localname, prefix, NULL, 0);
	}
    }
    /*
     * allocate the node
     */
    if (ctxt->freeElems != NULL) {
        ret = ctxt->freeElems;
	ctxt->freeElems = ret->next;
	ctxt->freeElemsNr--;
	memset(ret, 0, sizeof(xmlNode));
        ret->doc = ctxt->myDoc;
	ret->type = XML_ELEMENT_NODE;

	if (ctxt->dictNames)
	    ret->name = localname;
	else {
	    if (lname == NULL)
		ret->name = xmlStrdup(localname);
	    else
	        ret->name = lname;
	    if (ret->name == NULL) {
	        xmlSAX2ErrMemory(ctxt, "xmlSAX2StartElementNs");
		return;
	    }
	}
	if ((__xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	    xmlRegisterNodeDefaultValue(ret);
    } else {
	if (ctxt->dictNames)
	    ret = xmlNewDocNodeEatName(ctxt->myDoc, NULL,
	                               (xmlChar *) localname, NULL);
	else if (lname == NULL)
	    ret = xmlNewDocNode(ctxt->myDoc, NULL, localname, NULL);
	else
	    ret = xmlNewDocNodeEatName(ctxt->myDoc, NULL,
	                               (xmlChar *) lname, NULL);
	if (ret == NULL) {
	    xmlSAX2ErrMemory(ctxt, "xmlSAX2StartElementNs");
	    return;
	}
    }
    if (ctxt->linenumbers) {
	if (ctxt->input != NULL) {
	    if ((unsigned) ctxt->input->line < (unsigned) USHRT_MAX)
		ret->line = ctxt->input->line;
	    else
	        ret->line = USHRT_MAX;
	}
    }

    if (parent == NULL) {
        xmlAddChild((xmlNodePtr) ctxt->myDoc, (xmlNodePtr) ret);
    }
    /*
     * Build the namespace list
     */
    for (i = 0,j = 0;j < nb_namespaces;j++) {
        pref = namespaces[i++];
	uri = namespaces[i++];
	ns = xmlNewNs(NULL, uri, pref);
	if (ns != NULL) {
	    if (last == NULL) {
	        ret->nsDef = last = ns;
	    } else {
	        last->next = ns;
		last = ns;
	    }
	    if ((URI != NULL) && (prefix == pref))
		ret->ns = ns;
	} else {
            /*
             * any out of memory error would already have been raised
             * but we can't be guaranteed it's the actual error due to the
             * API, best is to skip in this case
             */
	    continue;
	}
#ifdef LIBXML_VALID_ENABLED
	if ((!ctxt->html) && ctxt->validate && ctxt->wellFormed &&
	    ctxt->myDoc && ctxt->myDoc->intSubset) {
	    ctxt->valid &= xmlValidateOneNamespace(&ctxt->vctxt, ctxt->myDoc,
	                                           ret, prefix, ns, uri);
	}
#endif /* LIBXML_VALID_ENABLED */
    }
    ctxt->nodemem = -1;

    /*
     * We are parsing a new node.
     */
    if (nodePush(ctxt, ret) < 0) {
        xmlUnlinkNode(ret);
        xmlFreeNode(ret);
        return;
    }

    /*
     * Link the child element
     */
    if (parent != NULL) {
        if (parent->type == XML_ELEMENT_NODE) {
	    xmlAddChild(parent, ret);
	} else {
	    xmlAddSibling(parent, ret);
	}
    }

    /*
     * Insert the defaulted attributes from the DTD only if requested:
     */
    if ((nb_defaulted != 0) &&
        ((ctxt->loadsubset & XML_COMPLETE_ATTRS) == 0))
	nb_attributes -= nb_defaulted;

    /*
     * Search the namespace if it wasn't already found
     * Note that, if prefix is NULL, this searches for the default Ns
     */
    if ((URI != NULL) && (ret->ns == NULL)) {
        ret->ns = xmlSearchNs(ctxt->myDoc, parent, prefix);
	if ((ret->ns == NULL) && (xmlStrEqual(prefix, BAD_CAST "xml"))) {
	    ret->ns = xmlSearchNs(ctxt->myDoc, ret, prefix);
	}
	if (ret->ns == NULL) {
	    ns = xmlNewNs(ret, NULL, prefix);
	    if (ns == NULL) {

	        xmlSAX2ErrMemory(ctxt, "xmlSAX2StartElementNs");
		return;
	    }
            if (prefix != NULL)
                xmlNsWarnMsg(ctxt, XML_NS_ERR_UNDEFINED_NAMESPACE,
                             "Namespace prefix %s was not found\n",
                             prefix, NULL);
            else
                xmlNsWarnMsg(ctxt, XML_NS_ERR_UNDEFINED_NAMESPACE,
                             "Namespace default prefix was not found\n",
                             NULL, NULL);
	}
    }

    /*
     * process all the other attributes
     */
    if (nb_attributes > 0) {
        for (j = 0,i = 0;i < nb_attributes;i++,j+=5) {
	    /*
	     * Handle the rare case of an undefined attribute prefix
	     */
	    if ((attributes[j+1] != NULL) && (attributes[j+2] == NULL)) {
		if (ctxt->dictNames) {
		    const xmlChar *fullname;

		    fullname = xmlDictQLookup(ctxt->dict, attributes[j+1],
		                              attributes[j]);
		    if (fullname != NULL) {
			xmlSAX2AttributeNs(ctxt, fullname, NULL,
			                   attributes[j+3], attributes[j+4]);
		        continue;
		    }
		} else {
		    lname = xmlBuildQName(attributes[j], attributes[j+1],
		                          NULL, 0);
		    if (lname != NULL) {
			xmlSAX2AttributeNs(ctxt, lname, NULL,
			                   attributes[j+3], attributes[j+4]);
			xmlFree(lname);
		        continue;
		    }
		}
	    }
	    xmlSAX2AttributeNs(ctxt, attributes[j], attributes[j+1],
			       attributes[j+3], attributes[j+4]);
	}
    }

#ifdef LIBXML_VALID_ENABLED
    /*
     * If it's the Document root, finish the DTD validation and
     * check the document root element for validity
     */
    if ((ctxt->validate) &&
        ((ctxt->vctxt.flags & XML_VCTXT_DTD_VALIDATED) == 0)) {
	int chk;

	chk = xmlValidateDtdFinal(&ctxt->vctxt, ctxt->myDoc);
	if (chk <= 0)
	    ctxt->valid = 0;
	if (chk < 0)
	    ctxt->wellFormed = 0;
	ctxt->valid &= xmlValidateRoot(&ctxt->vctxt, ctxt->myDoc);
	ctxt->vctxt.flags |= XML_VCTXT_DTD_VALIDATED;
    }
#endif /* LIBXML_VALID_ENABLED */
}